

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall kj::Exception::truncateCommonTrace(Exception *this)

{
  ulong uVar1;
  uint uVar2;
  uint in_ECX;
  uint uVar3;
  ulong uVar4;
  uint j;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  ArrayPtr<void_*const> AVar10;
  void *refTraceSpace [36];
  
  if (this->isFullTrace == true) {
    this->isFullTrace = false;
    if (this->traceCount != 0) {
      memset(refTraceSpace,0,0x120);
      AVar10 = getStackTrace((kj *)refTraceSpace,(ArrayPtr<void_*>)ZEXT816(0x24),in_ECX);
      uVar2 = this->traceCount;
      uVar1 = (ulong)(uint)AVar10.size_;
      while (uVar4 = uVar1, (int)uVar4 != 0) {
        uVar1 = uVar4 - 1;
        if (AVar10.ptr[uVar1 & 0xffffffff] == this->trace[uVar2 - 1]) {
          iVar6 = -1;
          uVar5 = 0;
          while (uVar4 != uVar5) {
            if (uVar2 == uVar5) {
              uVar3 = 0;
              goto LAB_002451d3;
            }
            uVar7 = (int)uVar4 + iVar6;
            uVar8 = uVar2 + iVar6;
            bVar9 = AVar10.size_ >> 1 < uVar5;
            uVar5 = uVar5 + 1;
            iVar6 = iVar6 + -1;
            if (bVar9 && AVar10.ptr[uVar7] != this->trace[uVar8]) {
              uVar3 = (uVar2 - (int)uVar5) + 1;
LAB_002451d3:
              this->traceCount = uVar3;
              return;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Exception::truncateCommonTrace() {
  if (isFullTrace) {
    // We're truncating the common portion of the full trace, turning it back into a limited
    // trace.
    isFullTrace = false;
  } else {
    // If the trace was never extended in the first place, trying to truncate it is at best a waste
    // of time and at worst might remove information for no reason. So, don't.
    //
    // This comes up in particular in coroutines, when the exception originated from a co_awaited
    // promise. In that case we manually add the one relevant frame to the trace, rather than
    // call extendTrace() just to have to truncate most of it again a moment later in the
    // unhandled_exception() callback.
    return;
  }

  if (traceCount > 0) {
    // Create a "reference" stack trace that is a little bit deeper than the one in the exception.
    void* refTraceSpace[sizeof(this->trace) / sizeof(this->trace[0]) + 4]{};
    auto refTrace = kj::getStackTrace(refTraceSpace, 0);

    // We expect that the deepest frame in the exception's stack trace should be somewhere in our
    // own trace, since our own trace has a deeper limit. Search for it.
    for (uint i = refTrace.size(); i > 0; i--) {
      if (refTrace[i-1] == trace[traceCount-1]) {
        // See how many frames match.
        for (uint j = 0; j < i; j++) {
          if (j >= traceCount) {
            // We matched the whole trace, apparently?
            traceCount = 0;
            return;
          } else if (refTrace[i-j-1] != trace[traceCount-j-1]) {
            // Found mismatching entry.

            // If we matched more than half of the reference trace, guess that this is in fact
            // the prefix we're looking for.
            if (j > refTrace.size() / 2) {
              // Delete the matching suffix.
              traceCount -= j;
              return;
            }
          }
        }
      }
    }

    // No match. Ignore.
  }
}